

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateAddDependency(HelicsFederate fed,char *fedName,HelicsError *err)

{
  string_view fedName_00;
  Federate *pFVar1;
  HelicsError *in_RDX;
  long in_RSI;
  Federate *fedObj;
  HelicsError *in_stack_ffffffffffffffc8;
  Federate *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  pFVar1 = getFed(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"Federate name for dependency cannot be null");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
                 (char *)in_stack_ffffffffffffffc8);
      fedName_00._M_str = (char *)pFVar1;
      fedName_00._M_len = in_stack_ffffffffffffffd8;
      helics::Federate::addDependency(in_stack_ffffffffffffffd0,fedName_00);
    }
  }
  return;
}

Assistant:

void helicsFederateAddDependency(HelicsFederate fed, const char* fedName, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (fedName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidFedNameString);
        return;
    }
    try {
        fedObj->addDependency(fedName);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}